

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void cmsysProcess_Execute(cmsysProcess *cp)

{
  int *p_00;
  int *p_01;
  pid_t *__ptr;
  cmsysProcess **__src;
  cmsysProcess **ppcVar1;
  int iVar2;
  int iVar3;
  pid_t *ppVar4;
  long lVar5;
  int *piVar6;
  kwsysProcessResults *pkVar7;
  char *pcVar8;
  long lVar9;
  int nextStdIn;
  int p_3 [2];
  int p [2];
  int local_dc;
  kwsysProcessInstances local_d8;
  _union_1457 local_c8;
  sigset_t sStack_c0;
  undefined4 local_40;
  
  if (cp == (cmsysProcess *)0x0) {
    return;
  }
  if (cp->State == 3) {
    return;
  }
  if (cp->NumberOfCommands < 1) {
    builtin_strncpy(cp->ErrorMessage,"No command",0xb);
    goto LAB_003d5ec1;
  }
  cp->PipeChildStd[0] = -1;
  cp->PipeChildStd[1] = -1;
  cp->PipeChildStd[2] = -1;
  cp->SignalPipe = -1;
  cp->PipeReadEnds[0] = -1;
  cp->PipeReadEnds[1] = -1;
  cp->PipeReadEnds[2] = -1;
  cp->PipeChildStd[0] = -1;
  cp->SelectError = 0;
  *(undefined4 *)&(cp->StartTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->StartTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_usec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
  memset(&cp->TimeoutExpired,0,0x8c);
  cp->State = 0;
  cp->Killed = 0;
  cp->ErrorMessage[0] = '\0';
  __ptr = cp->ForkPIDs;
  ppVar4 = (pid_t *)malloc((long)cp->NumberOfCommands << 2);
  cp->ForkPIDs = ppVar4;
  free(__ptr);
  if (cp->ForkPIDs != (pid_t *)0x0) {
    if (0 < cp->NumberOfCommands) {
      lVar5 = 0;
      do {
        cp->ForkPIDs[lVar5] = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 < cp->NumberOfCommands);
    }
    free(cp->CommandExitCodes);
    piVar6 = (int *)malloc((long)cp->NumberOfCommands << 2);
    cp->CommandExitCodes = piVar6;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0,(long)cp->NumberOfCommands << 2);
      free(cp->ProcessResults);
      pkVar7 = (kwsysProcessResults *)malloc((long)cp->NumberOfCommands * 0x414);
      cp->ProcessResults = pkVar7;
      if (pkVar7 != (kwsysProcessResults *)0x0) {
        memset(pkVar7,0,(long)cp->NumberOfCommands * 0x414);
        if (0 < cp->NumberOfCommands) {
          lVar5 = 0x10;
          lVar9 = 0;
          do {
            pkVar7 = cp->ProcessResults;
            pcVar8 = pkVar7->ExitExceptionString + lVar5 + -0x20;
            pcVar8[0] = '\0';
            pcVar8[1] = '\0';
            pcVar8[2] = '\0';
            pcVar8[3] = '\0';
            pcVar8[4] = '\0';
            pcVar8[5] = '\0';
            pcVar8[6] = '\0';
            pcVar8[7] = '\0';
            pcVar8[8] = '\x01';
            pcVar8[9] = '\0';
            pcVar8[10] = '\0';
            pcVar8[0xb] = '\0';
            pcVar8[0xc] = '\x01';
            pcVar8[0xd] = '\0';
            pcVar8[0xe] = '\0';
            pcVar8[0xf] = '\0';
            pcVar8 = pkVar7->ExitExceptionString + lVar5 + -0x10;
            pcVar8[0] = 'N';
            pcVar8[1] = 'o';
            pcVar8[2] = ' ';
            pcVar8[3] = 'e';
            pcVar8[4] = 'x';
            pcVar8[5] = 'c';
            pcVar8[6] = 'e';
            pcVar8[7] = 'p';
            pcVar8 = pkVar7->ExitExceptionString + lVar5 + -0xb;
            pcVar8[0] = 'c';
            pcVar8[1] = 'e';
            pcVar8[2] = 'p';
            pcVar8[3] = 't';
            pcVar8[4] = 'i';
            pcVar8[5] = 'o';
            pcVar8[6] = 'n';
            pcVar8[7] = '\0';
            lVar9 = lVar9 + 1;
            lVar5 = lVar5 + 0x414;
          } while (lVar9 < cp->NumberOfCommands);
        }
        if (cp->WorkingDirectory != (char *)0x0) {
          cp->RealWorkingDirectoryLength = 0x1000;
          pcVar8 = (char *)malloc(0x1000);
          cp->RealWorkingDirectory = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_003d5e82;
        }
        if (cp->WorkingDirectory != (char *)0x0) {
          pcVar8 = getcwd(cp->RealWorkingDirectory,(long)cp->RealWorkingDirectoryLength);
          if (pcVar8 != (char *)0x0) {
            do {
              iVar2 = chdir(cp->WorkingDirectory);
              if (-1 < iVar2) goto LAB_003d5edd;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
          }
          kwsysProcessCleanup(cp,1);
          return;
        }
LAB_003d5edd:
        if (cp->OptionDetach == 0) {
          iVar2 = pipe((int *)&local_c8);
          if (iVar2 < 0) goto LAB_003d651c;
          cp->PipeReadEnds[2] = local_c8._0_4_;
          cp->SignalPipe = local_c8._4_4_;
          iVar2 = kwsysProcessSetNonBlocking(local_c8._0_4_);
          if (iVar2 == 0) goto LAB_003d651c;
          iVar2 = kwsysProcessSetNonBlocking(local_c8._4_4_);
          if (iVar2 == 0) goto LAB_003d651c;
          iVar2 = fcntl(local_c8._0_4_,2,1);
          if (iVar2 < 0) goto LAB_003d651c;
          iVar3 = fcntl(local_c8._4_4_,2,1);
          __src = kwsysProcesses.Processes;
          iVar2 = kwsysProcesses.Count;
          if (iVar3 < 0) goto LAB_003d651c;
          lVar5 = (long)kwsysProcesses.Count;
          local_d8.Size = kwsysProcesses.Size;
          local_d8.Count = kwsysProcesses.Count;
          local_d8.Processes = kwsysProcesses.Processes;
          if (kwsysProcesses.Count == kwsysProcesses.Size) {
            local_d8.Size = 4;
            if (kwsysProcesses.Size != 0) {
              local_d8.Size = kwsysProcesses.Size * 2;
            }
            local_d8.Processes = (cmsysProcess **)malloc((long)local_d8.Size << 3);
            if (local_d8.Processes == (cmsysProcess **)0x0) goto LAB_003d651c;
            if (0 < iVar2) {
              memcpy(local_d8.Processes,__src,lVar5 * 8);
            }
          }
          ppcVar1 = local_d8.Processes;
          local_d8.Count = iVar2 + 1;
          local_d8.Processes[lVar5] = cp;
          kwsysProcessesUpdate(&local_d8);
          if (ppcVar1 != __src) {
            free(__src);
          }
          if (iVar2 == 0) {
            memset(&local_c8,0,0x98);
            local_c8.sa_handler = kwsysProcessesSignalHandler;
            local_40 = 0x10000005;
            sigemptyset(&sStack_c0);
            do {
              iVar2 = sigaction(0x11,(sigaction *)&local_c8,
                                (sigaction *)&kwsysProcessesOldSigChldAction);
              if (-1 < iVar2) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            sigemptyset(&sStack_c0);
            sigaddset(&sStack_c0,0xf);
            do {
              iVar2 = sigaction(2,(sigaction *)&local_c8,(sigaction *)&kwsysProcessesOldSigIntAction
                               );
              if (-1 < iVar2) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            sigemptyset(&sStack_c0);
            sigaddset(&sStack_c0,2);
            do {
              iVar2 = sigaction(0xf,(sigaction *)&local_c8,
                                (sigaction *)&kwsysProcessesOldSigIntAction);
              if (-1 < iVar2) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
          }
        }
        piVar6 = cp->PipeChildStd;
        if (cp->PipeFileSTDIN == (char *)0x0) {
          iVar2 = 0;
          if (cp->PipeSharedSTDIN == 0) {
            iVar2 = cp->PipeNativeSTDIN[0];
            if (-1 < iVar2) {
              *piVar6 = iVar2;
              iVar2 = fcntl(iVar2,2,1);
              if (iVar2 < 0) goto LAB_003d651c;
              iVar2 = cp->PipeNativeSTDIN[1];
              goto LAB_003d5f10;
            }
            iVar2 = -1;
          }
          *piVar6 = iVar2;
        }
        else {
          iVar2 = open(cp->PipeFileSTDIN,0);
          *piVar6 = iVar2;
          if (iVar2 < 0) goto LAB_003d651c;
LAB_003d5f10:
          iVar2 = fcntl(iVar2,2,1);
          if (iVar2 < 0) goto LAB_003d651c;
        }
        iVar2 = pipe((int *)&local_c8);
        if (iVar2 < 0) goto LAB_003d651c;
        cp->PipeReadEnds[0] = local_c8._0_4_;
        cp->PipeChildStd[1] = local_c8._4_4_;
        iVar2 = fcntl(local_c8._0_4_,2,1);
        if (iVar2 < 0) goto LAB_003d651c;
        iVar2 = fcntl(local_c8._4_4_,2,1);
        if (iVar2 < 0) goto LAB_003d651c;
        iVar2 = kwsysProcessSetNonBlocking(local_c8._0_4_);
        if (iVar2 == 0) goto LAB_003d651c;
        p_00 = cp->PipeChildStd + 1;
        if (cp->PipeFileSTDOUT == (char *)0x0) {
          if (cp->PipeSharedSTDOUT == 0) {
            if (-1 < cp->PipeNativeSTDOUT[1]) {
              iVar2 = kwsysProcessSetupOutputPipeNative(p_00,cp->PipeNativeSTDOUT);
              goto LAB_003d61b1;
            }
          }
          else {
            kwsysProcessCleanupDescriptor(p_00);
            *p_00 = 1;
          }
        }
        else {
          iVar2 = kwsysProcessSetupOutputPipeFile(p_00,cp->PipeFileSTDOUT);
LAB_003d61b1:
          if (iVar2 == 0) goto LAB_003d651c;
        }
        iVar2 = pipe((int *)&local_c8);
        if (-1 < iVar2) {
          cp->PipeReadEnds[1] = local_c8._0_4_;
          cp->PipeChildStd[2] = local_c8._4_4_;
          iVar2 = fcntl(local_c8._0_4_,2,1);
          if (iVar2 < 0) goto LAB_003d651c;
          iVar2 = fcntl(local_c8._4_4_,2,1);
          if (iVar2 < 0) goto LAB_003d651c;
          iVar2 = kwsysProcessSetNonBlocking(local_c8._0_4_);
          if (iVar2 == 0) goto LAB_003d651c;
          p_01 = cp->PipeChildStd + 2;
          if (cp->PipeFileSTDERR == (char *)0x0) {
            if (cp->PipeSharedSTDERR != 0) {
              kwsysProcessCleanupDescriptor(p_01);
              *p_01 = 2;
              goto LAB_003d62d6;
            }
            if (cp->PipeNativeSTDERR[1] < 0) goto LAB_003d62d6;
            iVar2 = kwsysProcessSetupOutputPipeNative(p_01,cp->PipeNativeSTDERR);
          }
          else {
            iVar2 = kwsysProcessSetupOutputPipeFile(p_01,cp->PipeFileSTDERR);
          }
          if (iVar2 != 0) {
LAB_003d62d6:
            clock_gettime(1,(timespec *)&local_c8);
            (cp->StartTime).tv_sec = (long)local_c8;
            (cp->StartTime).tv_usec =
                 CONCAT44(sStack_c0.__val[0]._4_4_,(int)sStack_c0.__val[0]) / 1000;
            *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
            *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
            *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
            *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
            local_c8 = (_union_1457)0xffffffffffffffff;
            sStack_c0.__val[0]._0_4_ = -1;
            sStack_c0.__val[0]._4_4_ = 0xffffffff;
            sStack_c0.__val[1]._0_4_ = 0xffffffff;
            local_dc = cp->PipeChildStd[0];
            if (0 < cp->NumberOfCommands) {
              iVar2 = 0;
              do {
                iVar3 = local_dc;
                local_c8._0_4_ = local_dc;
                if (iVar2 != cp->NumberOfCommands + -1) {
                  local_d8.Count = -1;
                  local_d8.Size = -1;
                  iVar3 = pipe(&local_d8.Count);
                  if (-1 < iVar3) {
                    iVar3 = fcntl(local_d8.Count,2,1);
                    if (-1 < iVar3) {
                      iVar3 = fcntl(local_d8.Size,2,1);
                      if (-1 < iVar3) {
                        local_dc = local_d8.Count;
                        local_c8._4_4_ = local_d8.Size;
                        goto LAB_003d63ce;
                      }
                    }
                    close(local_d8.Count);
                    close(local_d8.Size);
                  }
LAB_003d6509:
                  if (local_dc != *piVar6) {
                    kwsysProcessCleanupDescriptor(&local_dc);
                  }
                  goto LAB_003d651c;
                }
                local_dc = -1;
                local_c8._4_4_ = *p_00;
                local_c8._0_4_ = iVar3;
LAB_003d63ce:
                sStack_c0.__val[0]._0_4_ = cp->PipeChildStd[(ulong)(cp->MergeOutput == 0) + 1];
                iVar3 = kwsysProcessCreate(cp,iVar2,(kwsysProcessCreateInformation *)&local_c8);
                if (local_c8._0_4_ != cp->PipeChildStd[0]) {
                  kwsysProcessCleanupDescriptor((int *)&local_c8);
                }
                if (local_c8._4_4_ != *p_00) {
                  kwsysProcessCleanupDescriptor((int *)((long)&local_c8 + 4));
                }
                if (((int)sStack_c0.__val[0] != *p_01) && (cp->MergeOutput == 0)) {
                  kwsysProcessCleanupDescriptor((int *)&sStack_c0);
                }
                if (iVar3 == 0) {
                  kwsysProcessCleanupDescriptor((int *)((long)sStack_c0.__val + 4));
                  kwsysProcessCleanupDescriptor((int *)(sStack_c0.__val + 1));
                  goto LAB_003d6509;
                }
                iVar2 = iVar2 + 1;
              } while (iVar2 < cp->NumberOfCommands);
            }
            lVar5 = 0;
            do {
              kwsysProcessCleanupDescriptor((int *)(lVar5 + (long)piVar6));
              lVar5 = lVar5 + 4;
            } while (lVar5 != 0xc);
            if (cp->RealWorkingDirectory != (char *)0x0) {
              do {
                iVar2 = chdir(cp->RealWorkingDirectory);
                if (-1 < iVar2) break;
                piVar6 = __errno_location();
              } while (*piVar6 == 4);
              free(cp->RealWorkingDirectory);
              cp->RealWorkingDirectory = (char *)0x0;
            }
            cp->PipesLeft = 3;
            cp->State = 3;
            cp->Detached = cp->OptionDetach;
            return;
          }
        }
LAB_003d651c:
        kwsysProcessCleanup(cp,1);
        return;
      }
    }
  }
LAB_003d5e82:
  builtin_strncpy(cp->ErrorMessage,"Out of memory",0xe);
LAB_003d5ec1:
  cp->State = 1;
  return;
}

Assistant:

void kwsysProcess_Execute(kwsysProcess* cp)
{
  int i;

  /* Do not execute a second copy simultaneously.  */
  if (!cp || cp->State == kwsysProcess_State_Executing) {
    return;
  }

  /* Make sure we have something to run.  */
  if (cp->NumberOfCommands < 1) {
    strcpy(cp->ErrorMessage, "No command");
    cp->State = kwsysProcess_State_Error;
    return;
  }

  /* Initialize the control structure for a new process.  */
  if (!kwsysProcessInitialize(cp)) {
    strcpy(cp->ErrorMessage, "Out of memory");
    cp->State = kwsysProcess_State_Error;
    return;
  }

#if defined(__VMS)
  /* Make sure pipes behave like streams on VMS.  */
  if (!kwsysProcessSetVMSFeature("DECC$STREAM_PIPE", 1)) {
    kwsysProcessCleanup(cp, 1);
    return;
  }
#endif

  /* Save the real working directory of this process and change to
     the working directory for the child processes.  This is needed
     to make pipe file paths evaluate correctly.  */
  if (cp->WorkingDirectory) {
    int r;
    if (!getcwd(cp->RealWorkingDirectory,
                (size_t)(cp->RealWorkingDirectoryLength))) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while (((r = chdir(cp->WorkingDirectory)) < 0) && (errno == EINTR))
      ;
    if (r < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* If not running a detached child, add this object to the global
     set of process objects that wish to be notified when a child
     exits.  */
  if (!cp->OptionDetach) {
    if (!kwsysProcessesAdd(cp)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* Setup the stdin pipe for the first process.  */
  if (cp->PipeFileSTDIN) {
    /* Open a file for the child's stdin to read.  */
    cp->PipeChildStd[0] = open(cp->PipeFileSTDIN, O_RDONLY);
    if (cp->PipeChildStd[0] < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set close-on-exec flag on the pipe's end.  */
    if (fcntl(cp->PipeChildStd[0], F_SETFD, FD_CLOEXEC) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDIN) {
    cp->PipeChildStd[0] = 0;
  } else if (cp->PipeNativeSTDIN[0] >= 0) {
    cp->PipeChildStd[0] = cp->PipeNativeSTDIN[0];

    /* Set close-on-exec flag on the pipe's ends.  The read end will
       be dup2-ed into the stdin descriptor after the fork but before
       the exec.  */
    if ((fcntl(cp->PipeNativeSTDIN[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(cp->PipeNativeSTDIN[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else {
    cp->PipeChildStd[0] = -1;
  }

  /* Create the output pipe for the last process.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
    /* Create the pipe.  */
    int p[2];
    if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Store the pipe.  */
    cp->PipeReadEnds[KWSYSPE_PIPE_STDOUT] = p[0];
    cp->PipeChildStd[1] = p[1];

    /* Set close-on-exec flag on the pipe's ends.  */
    if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set to non-blocking in case select lies, or for the polling
       implementation.  */
    if (!kwsysProcessSetNonBlocking(p[0])) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  if (cp->PipeFileSTDOUT) {
    /* Use a file for stdout.  */
    if (!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[1],
                                         cp->PipeFileSTDOUT)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDOUT) {
    /* Use the parent stdout.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[1]);
    cp->PipeChildStd[1] = 1;
  } else if (cp->PipeNativeSTDOUT[1] >= 0) {
    /* Use the given descriptor for stdout.  */
    if (!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[1],
                                           cp->PipeNativeSTDOUT)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* Create stderr pipe to be shared by all processes in the pipeline.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
    /* Create the pipe.  */
    int p[2];
    if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Store the pipe.  */
    cp->PipeReadEnds[KWSYSPE_PIPE_STDERR] = p[0];
    cp->PipeChildStd[2] = p[1];

    /* Set close-on-exec flag on the pipe's ends.  */
    if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set to non-blocking in case select lies, or for the polling
       implementation.  */
    if (!kwsysProcessSetNonBlocking(p[0])) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  if (cp->PipeFileSTDERR) {
    /* Use a file for stderr.  */
    if (!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[2],
                                         cp->PipeFileSTDERR)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDERR) {
    /* Use the parent stderr.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[2]);
    cp->PipeChildStd[2] = 2;
  } else if (cp->PipeNativeSTDERR[1] >= 0) {
    /* Use the given handle for stderr.  */
    if (!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[2],
                                           cp->PipeNativeSTDERR)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* The timeout period starts now.  */
  cp->StartTime = kwsysProcessTimeGetCurrent();
  cp->TimeoutTime.tv_sec = -1;
  cp->TimeoutTime.tv_usec = -1;

  /* Create the pipeline of processes.  */
  {
    kwsysProcessCreateInformation si = { -1, -1, -1, { -1, -1 } };
    int nextStdIn = cp->PipeChildStd[0];
    for (i = 0; i < cp->NumberOfCommands; ++i) {
      /* Setup the process's pipes.  */
      si.StdIn = nextStdIn;
      if (i == cp->NumberOfCommands - 1) {
        nextStdIn = -1;
        si.StdOut = cp->PipeChildStd[1];
      } else {
        /* Create a pipe to sit between the children.  */
        int p[2] = { -1, -1 };
        if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }

        /* Set close-on-exec flag on the pipe's ends.  */
        if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
            (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
          close(p[0]);
          close(p[1]);
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }
        nextStdIn = p[0];
        si.StdOut = p[1];
      }
      si.StdErr = cp->MergeOutput ? cp->PipeChildStd[1] : cp->PipeChildStd[2];

      {
        int res = kwsysProcessCreate(cp, i, &si);

        /* Close our copies of pipes used between children.  */
        if (si.StdIn != cp->PipeChildStd[0]) {
          kwsysProcessCleanupDescriptor(&si.StdIn);
        }
        if (si.StdOut != cp->PipeChildStd[1]) {
          kwsysProcessCleanupDescriptor(&si.StdOut);
        }
        if (si.StdErr != cp->PipeChildStd[2] && !cp->MergeOutput) {
          kwsysProcessCleanupDescriptor(&si.StdErr);
        }

        if (!res) {
          kwsysProcessCleanupDescriptor(&si.ErrorPipe[0]);
          kwsysProcessCleanupDescriptor(&si.ErrorPipe[1]);
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }
      }
    }
  }

  /* The parent process does not need the child's pipe ends.  */
  for (i = 0; i < 3; ++i) {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
  }

  /* Restore the working directory. */
  if (cp->RealWorkingDirectory) {
    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while ((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR))
      ;
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
  }

  /* All the pipes are now open.  */
  cp->PipesLeft = KWSYSPE_PIPE_COUNT;

  /* The process has now started.  */
  cp->State = kwsysProcess_State_Executing;
  cp->Detached = cp->OptionDetach;
}